

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial.h
# Opt level: O3

SpatialBinSplit<16UL> * __thiscall
embree::sse2::SpatialBinInfo<16UL,_embree::PrimRef>::best
          (SpatialBinSplit<16UL> *__return_storage_ptr__,SpatialBinInfo<16UL,_embree::PrimRef> *this
          ,SpatialBinMapping<16UL> *mapping,size_t blocks_shift)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  int dim;
  long lVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  uint uVar24;
  uint uVar25;
  undefined1 auVar23 [16];
  uint uVar26;
  undefined1 auVar27 [16];
  uint uVar28;
  uint uVar30;
  uint uVar31;
  undefined1 auVar29 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  float fVar44;
  undefined1 auVar45 [16];
  vfloat4 rAreas [16];
  vuint4 rCounts [16];
  undefined8 uStack_908;
  float afStack_900 [62];
  int aiStack_808 [4];
  float afStack_7f8 [64];
  uint auStack_6f8 [284];
  float local_288;
  float fStack_284;
  float fStack_280;
  uint local_248 [4];
  uint local_238 [4];
  uint local_228 [4];
  undefined1 local_218 [2] [16];
  float afStack_1f8 [64];
  uint auStack_f8 [50];
  int aiStack_30 [12];
  
  paVar10 = &this->bounds[0xf][2].upper.field_0;
  iVar18 = 0;
  iVar19 = 0;
  iVar20 = 0;
  iVar21 = 0;
  lVar13 = 0x7f0;
  auVar16 = _DAT_01f7a9f0;
  auVar17 = _DAT_01f7aa00;
  auVar23 = _DAT_01f7aa00;
  auVar27 = _DAT_01f7a9f0;
  auVar29 = _DAT_01f7aa00;
  auVar32 = _DAT_01f7a9f0;
  do {
    piVar1 = (int *)((long)&this->bounds[0][0].lower.field_0 + lVar13);
    iVar18 = iVar18 + *piVar1;
    iVar19 = iVar19 + piVar1[1];
    iVar20 = iVar20 + piVar1[2];
    iVar21 = iVar21 + piVar1[3];
    *(int *)((long)aiStack_808 + lVar13) = iVar18;
    *(int *)((long)aiStack_808 + lVar13 + 4) = iVar19;
    *(int *)((long)aiStack_808 + lVar13 + 8) = iVar20;
    *(int *)((long)aiStack_808 + lVar13 + 0xc) = iVar21;
    auVar16 = minps(auVar16,(undefined1  [16])paVar10[-5]);
    auVar17 = maxps(auVar17,(undefined1  [16])paVar10[-4]);
    fVar33 = auVar17._4_4_ - auVar16._4_4_;
    fVar34 = auVar17._8_4_ - auVar16._8_4_;
    auVar27 = minps(auVar27,(undefined1  [16])paVar10[-3]);
    auVar23 = maxps(auVar23,(undefined1  [16])paVar10[-2]);
    fVar35 = auVar23._4_4_ - auVar27._4_4_;
    fVar36 = auVar23._8_4_ - auVar27._8_4_;
    *(ulong *)((long)&uStack_908 + lVar13) =
         CONCAT44((auVar23._0_4_ - auVar27._0_4_) * (fVar35 + fVar36) + fVar36 * fVar35,
                  (auVar17._0_4_ - auVar16._0_4_) * (fVar33 + fVar34) + fVar34 * fVar33);
    auVar32 = minps(auVar32,(undefined1  [16])paVar10[-1]);
    auVar29 = maxps(auVar29,(undefined1  [16])*paVar10);
    fVar33 = auVar29._4_4_ - auVar32._4_4_;
    fVar34 = auVar29._8_4_ - auVar32._8_4_;
    *(float *)((long)afStack_900 + lVar13) =
         (fVar33 + fVar34) * (auVar29._0_4_ - auVar32._0_4_) + fVar34 * fVar33;
    *(undefined4 *)((long)afStack_900 + lVar13 + 4) = 0;
    lVar13 = lVar13 + -0x10;
    paVar10 = paVar10 + -6;
  } while (lVar13 != 0x700);
  uVar11 = 0xffffffff;
  uVar12 = ~(-1 << ((byte)blocks_shift & 0x1f));
  local_238[0] = 0;
  local_238[1] = 0;
  local_238[2] = 0;
  uVar38 = 1;
  uVar40 = 1;
  uVar42 = 1;
  uVar28 = 0;
  uVar30 = 0;
  uVar31 = 0;
  iVar18 = 0;
  lVar13 = 0x50;
  lVar14 = 0x600;
  local_228[0] = 0;
  local_228[1] = 0;
  local_228[2] = 0;
  local_248[0] = 0;
  local_248[1] = 0;
  local_248[2] = 0;
  auVar16 = _DAT_01f7aa00;
  auVar17 = _DAT_01f7aa00;
  auVar23 = _DAT_01f7a9f0;
  auVar27 = _DAT_01f7aa00;
  auVar29 = _DAT_01f7a9f0;
  auVar32 = _DAT_01f7a9f0;
  local_218[0] = _DAT_01f7a9f0;
  do {
    piVar1 = (int *)((long)&this->bounds[0][0].lower.field_0 + lVar14);
    uVar28 = uVar28 + *piVar1;
    uVar30 = uVar30 + piVar1[1];
    uVar31 = uVar31 + piVar1[2];
    iVar18 = iVar18 + piVar1[3];
    auVar23 = minps(auVar23,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x10 + lVar13));
    auVar17 = maxps(auVar17,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x20 + lVar13));
    local_288 = auVar17._0_4_;
    fStack_284 = auVar17._4_4_;
    fStack_280 = auVar17._8_4_;
    fStack_284 = fStack_284 - auVar23._4_4_;
    fStack_280 = fStack_280 - auVar23._8_4_;
    auVar29 = minps(auVar29,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x30 + lVar13));
    auVar16 = maxps(auVar16,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x40 + lVar13));
    fVar33 = auVar16._4_4_ - auVar29._4_4_;
    fVar34 = auVar16._8_4_ - auVar29._8_4_;
    auVar32 = minps(auVar32,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x50 + lVar13));
    auVar27 = maxps(auVar27,*(undefined1 (*) [16])((long)&this->bounds[0][0].lower.field_0 + lVar13)
                   );
    fVar35 = auVar27._0_4_ - auVar32._0_4_;
    fVar36 = auVar27._4_4_ - auVar32._4_4_;
    fVar44 = auVar27._8_4_ - auVar32._8_4_;
    uVar15 = blocks_shift & 0xffffffff;
    uVar22 = uVar28 + uVar12 >> uVar15;
    uVar24 = uVar30 + uVar12 >> uVar15;
    uVar25 = uVar31 + uVar12 >> uVar15;
    uVar26 = iVar18 + uVar12 >> uVar15;
    uVar2 = *(uint *)((long)auStack_6f8 + lVar14 + 4);
    uVar3 = *(uint *)((long)auStack_6f8 + lVar14 + 8);
    uVar37 = uVar12 + *(uint *)((long)auStack_6f8 + lVar14) >> uVar15;
    uVar39 = uVar12 + uVar2 >> uVar15;
    uVar41 = uVar12 + uVar3 >> uVar15;
    uVar43 = uVar12 + *(int *)((long)auStack_6f8 + lVar14 + 0xc) >> uVar15;
    auVar45._0_4_ =
         ((float)(uVar37 & 0x7fffffff) + (float)((int)uVar37 >> 0x1f & 0x4f000000)) *
         *(float *)((long)afStack_7f8 + lVar14) +
         ((float)(uVar22 & 0x7fffffff) + (float)((int)uVar22 >> 0x1f & 0x4f000000)) *
         ((local_288 - auVar23._0_4_) * (fStack_284 + fStack_280) + fStack_280 * fStack_284);
    auVar45._4_4_ =
         ((float)(uVar39 & 0x7fffffff) + (float)((int)uVar39 >> 0x1f & 0x4f000000)) *
         *(float *)((long)afStack_7f8 + lVar14 + 4) +
         ((float)(uVar24 & 0x7fffffff) + (float)((int)uVar24 >> 0x1f & 0x4f000000)) *
         ((auVar16._0_4_ - auVar29._0_4_) * (fVar33 + fVar34) + fVar34 * fVar33);
    auVar45._8_4_ =
         ((float)(uVar41 & 0x7fffffff) + (float)((int)uVar41 >> 0x1f & 0x4f000000)) *
         *(float *)((long)afStack_7f8 + lVar14 + 8) +
         ((float)(uVar25 & 0x7fffffff) + (float)((int)uVar25 >> 0x1f & 0x4f000000)) *
         (fVar35 * (fVar44 + fVar36) + fVar36 * fVar44);
    auVar45._12_4_ =
         ((float)(uVar43 & 0x7fffffff) + (float)((int)uVar43 >> 0x1f & 0x4f000000)) *
         *(float *)((long)afStack_7f8 + lVar14 + 0xc) +
         ((float)(uVar26 & 0x7fffffff) + (float)((int)uVar26 >> 0x1f & 0x4f000000)) *
         (fVar35 * (fVar36 + fVar44) + fVar44 * fVar36);
    uVar22 = -(uint)(local_218[0]._0_4_ <= auVar45._0_4_);
    uVar24 = -(uint)(local_218[0]._4_4_ <= auVar45._4_4_);
    uVar25 = -(uint)(local_218[0]._8_4_ <= auVar45._8_4_);
    local_228[0] = local_228[0] & uVar22 | ~uVar22 & uVar38;
    local_228[1] = local_228[1] & uVar24 | ~uVar24 & uVar40;
    local_228[2] = local_228[2] & uVar25 | ~uVar25 & uVar42;
    local_218[0] = minps(auVar45,local_218[0]);
    local_238[0] = local_238[0] & uVar22 | ~uVar22 & uVar28;
    local_238[1] = local_238[1] & uVar24 | ~uVar24 & uVar30;
    local_238[2] = local_238[2] & uVar25 | ~uVar25 & uVar31;
    local_248[0] = ~uVar22 & *(uint *)((long)auStack_6f8 + lVar14) | local_248[0] & uVar22;
    local_248[1] = ~uVar24 & uVar2 | local_248[1] & uVar24;
    local_248[2] = ~uVar25 & uVar3 | local_248[2] & uVar25;
    uVar38 = uVar38 + 1;
    uVar40 = uVar40 + 1;
    uVar42 = uVar42 + 1;
    lVar13 = lVar13 + 0x60;
    lVar14 = lVar14 + 0x10;
  } while (lVar13 != 0x5f0);
  fVar33 = INFINITY;
  uVar15 = 0;
  uVar28 = 0;
  uVar12 = 0;
  uVar30 = 0;
  do {
    fVar34 = (mapping->scale).field_0.v[uVar15];
    if ((((fVar34 != 0.0) || (NAN(fVar34))) && (afStack_1f8[uVar15 - 8] < fVar33)) &&
       (local_228[uVar15] != 0)) {
      uVar12 = local_238[uVar15];
      uVar28 = local_248[uVar15];
      uVar11 = uVar15 & 0xffffffff;
      uVar30 = local_228[uVar15];
      fVar33 = afStack_1f8[uVar15 - 8];
    }
    uVar15 = uVar15 + 1;
  } while (uVar15 != 3);
  if ((int)uVar11 == -1) {
    uVar12 = 0xffffffff;
    uVar30 = 0;
    fVar33 = INFINITY;
    uVar28 = uVar12;
  }
  uVar4 = *(undefined8 *)&(mapping->ofs).field_0;
  uVar5 = *(undefined8 *)((long)&(mapping->ofs).field_0 + 8);
  uVar6 = *(undefined8 *)&(mapping->scale).field_0;
  uVar7 = *(undefined8 *)((long)&(mapping->scale).field_0 + 8);
  uVar8 = *(undefined8 *)&(mapping->inv_scale).field_0;
  uVar9 = *(undefined8 *)((long)&(mapping->inv_scale).field_0 + 8);
  __return_storage_ptr__->sah = fVar33;
  __return_storage_ptr__->dim = (int)uVar11;
  __return_storage_ptr__->pos = uVar30;
  __return_storage_ptr__->left = uVar12;
  __return_storage_ptr__->right = uVar28;
  __return_storage_ptr__->factor = 1.0;
  *(undefined8 *)&(__return_storage_ptr__->mapping).ofs.field_0 = uVar4;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) = uVar5;
  *(undefined8 *)&(__return_storage_ptr__->mapping).scale.field_0 = uVar6;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) = uVar7;
  *(undefined8 *)&(__return_storage_ptr__->mapping).inv_scale.field_0 = uVar8;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).inv_scale.field_0 + 8) = uVar9;
  return __return_storage_ptr__;
}

Assistant:

SpatialBinSplit<BINS> best(const SpatialBinMapping<BINS>& mapping, const size_t blocks_shift) const 
      {
        /* sweep from right to left and compute parallel prefix of merged bounds */
        vfloat4 rAreas[BINS];
        vuint4 rCounts[BINS];
        vuint4 count = 0; BBox3fa bx = empty; BBox3fa by = empty; BBox3fa bz = empty;
        for (size_t i=BINS-1; i>0; i--)
        {
          count += numEnd[i];
          rCounts[i] = count;
          bx.extend(bounds[i][0]); rAreas[i][0] = halfArea(bx);
          by.extend(bounds[i][1]); rAreas[i][1] = halfArea(by);
          bz.extend(bounds[i][2]); rAreas[i][2] = halfArea(bz);
          rAreas[i][3] = 0.0f;
        }
        
        /* sweep from left to right and compute SAH */
        vuint4 blocks_add = (1 << blocks_shift)-1;
        vuint4 ii = 1; vfloat4 vbestSAH = pos_inf; vuint4 vbestPos = 0; vuint4 vbestlCount = 0; vuint4 vbestrCount = 0;
        count = 0; bx = empty; by = empty; bz = empty;
        for (size_t i=1; i<BINS; i++, ii+=1)
        {
          count += numBegin[i-1];
          bx.extend(bounds[i-1][0]); float Ax = halfArea(bx);
          by.extend(bounds[i-1][1]); float Ay = halfArea(by);
          bz.extend(bounds[i-1][2]); float Az = halfArea(bz);
          const vfloat4 lArea = vfloat4(Ax,Ay,Az,Az);
          const vfloat4 rArea = rAreas[i];
          const vuint4 lCount = (count     +blocks_add) >> (unsigned int)(blocks_shift);
          const vuint4 rCount = (rCounts[i]+blocks_add) >> (unsigned int)(blocks_shift);
          const vfloat4 sah = madd(lArea,vfloat4(lCount),rArea*vfloat4(rCount));
          // const vfloat4 sah = madd(lArea,vfloat4(vint4(lCount)),rArea*vfloat4(vint4(rCount)));
          const vbool4 mask = sah < vbestSAH;
          vbestPos      = select(mask,ii ,vbestPos);
          vbestSAH      = select(mask,sah,vbestSAH);
          vbestlCount   = select(mask,count,vbestlCount);
          vbestrCount   = select(mask,rCounts[i],vbestrCount);
        }
        
        /* find best dimension */
        float bestSAH = inf;
        int   bestDim = -1;
        int   bestPos = 0;
        unsigned int   bestlCount = 0;
        unsigned int   bestrCount = 0;
        for (int dim=0; dim<3; dim++) 
        {
          /* ignore zero sized dimensions */
          if (unlikely(mapping.invalid(dim)))
            continue;
          
          /* test if this is a better dimension */
          if (vbestSAH[dim] < bestSAH && vbestPos[dim] != 0) {
            bestDim = dim;
            bestPos = vbestPos[dim];
            bestSAH = vbestSAH[dim];
            bestlCount = vbestlCount[dim];
            bestrCount = vbestrCount[dim];
          }
        }
        assert(bestSAH >= 0.0f);
        
        /* return invalid split if no split found */
        if (bestDim == -1) 
          return SpatialBinSplit<BINS>(inf,-1,0,mapping);
        
        /* return best found split */
        return SpatialBinSplit<BINS>(bestSAH,bestDim,bestPos,bestlCount,bestrCount,1.0f,mapping);
      }